

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

void al_set_new_bitmap_format(int format)

{
  thread_local_state *ptVar1;
  int in_EDI;
  thread_local_state *tls;
  
  ptVar1 = tls_get();
  if (ptVar1 != (thread_local_state *)0x0) {
    ptVar1->new_bitmap_format = in_EDI;
  }
  return;
}

Assistant:

void al_set_new_bitmap_format(int format)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return;
   tls->new_bitmap_format = format;
}